

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThread.cxx
# Opt level: O2

ScopesResponse * __thiscall
cmDebugger::cmDebuggerThread::GetScopesResponse
          (ScopesResponse *__return_storage_ptr__,cmDebuggerThread *this,int64_t frameId,
          bool supportsVariableType)

{
  iterator iVar1;
  iterator iVar2;
  vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>>>
  *this_00;
  mapped_type *this_01;
  shared_ptr<cmDebugger::cmDebuggerVariables> localVariables;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> frame;
  unique_lock<std::mutex> lock;
  Source source;
  Scope scope;
  int64_t local_380;
  shared_ptr<cmDebugger::cmDebuggerVariables> local_378;
  __shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2> local_368;
  unique_lock<std::mutex> local_358;
  Source local_348;
  undefined1 local_218 [136];
  optional<std::__cxx11::string> local_190 [40];
  optional<dap::Source> local_168;
  integer local_30;
  
  local_380 = frameId;
  std::unique_lock<std::mutex>::unique_lock(&local_358,&this->Mutex);
  iVar1 = std::
          _Hashtable<long,_std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_std::allocator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->FrameScopes)._M_h,&local_380);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    iVar2 = std::
            _Hashtable<long,_std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->FrameMap)._M_h,&local_380);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      std::__shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_368,
                 (__shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar2.
                        super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
                        ._M_cur + 0x10));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_218,"Locals",(allocator<char> *)&local_348);
      cmDebuggerVariablesHelper::Create
                ((cmDebuggerVariablesHelper *)&local_378,&this->VariablesManager,(string *)local_218
                 ,supportsVariableType,(shared_ptr<cmDebugger::cmDebuggerStackFrame> *)&local_368);
      std::__cxx11::string::~string((string *)local_218);
      this_00 = (vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>>>
                 *)std::__detail::
                   _Map_base<long,_std::pair<const_long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>,_std::allocator<std::pair<const_long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<long,_std::pair<const_long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>,_std::allocator<std::pair<const_long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->FrameVariables,&local_380);
      std::
      vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>>>
      ::emplace_back<std::shared_ptr<cmDebugger::cmDebuggerVariables>&>(this_00,&local_378);
      dap::Scope::Scope((Scope *)local_218);
      cmDebuggerVariables::GetName_abi_cxx11_
                ((string *)&local_348,
                 local_378.
                 super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      std::__cxx11::string::operator=((string *)(local_218 + 0x58),(string *)&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      dap::optional<std::__cxx11::string>::operator=(local_190,(char (*) [7])"locals");
      local_30.val = (local_378.
                      super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->Id;
      dap::Source::Source(&local_348);
      dap::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&local_348.name,&(local_368._M_ptr)->FileName);
      dap::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&local_348.path,&local_348.name);
      dap::optional<dap::Source>::operator=(&local_168,&local_348);
      this_01 = std::__detail::
                _Map_base<long,_std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_std::allocator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long,_std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_std::allocator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->FrameScopes,&local_380);
      std::vector<dap::Scope,_std::allocator<dap::Scope>_>::push_back
                (this_01,(value_type *)local_218);
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<dap::Scope,_std::allocator<dap::Scope>_>::push_back
                (&__return_storage_ptr__->scopes,(value_type *)local_218);
      dap::Source::~Source(&local_348);
      dap::Scope::~Scope((Scope *)local_218);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_378.
                  super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
    }
  }
  else {
    (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<dap::Scope,_std::allocator<dap::Scope>_>::operator=
              (&__return_storage_ptr__->scopes,
               (vector<dap::Scope,_std::allocator<dap::Scope>_> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_false>
                      ._M_cur + 0x10));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_358);
  return __return_storage_ptr__;
}

Assistant:

dap::ScopesResponse cmDebuggerThread::GetScopesResponse(
  int64_t frameId, bool supportsVariableType)
{
  std::unique_lock<std::mutex> lock(Mutex);
  auto it = FrameScopes.find(frameId);

  if (it != FrameScopes.end()) {
    dap::ScopesResponse response;
    response.scopes = it->second;
    return response;
  }

  auto it2 = FrameMap.find(frameId);
  if (it2 == FrameMap.end()) {
    return dap::ScopesResponse();
  }

  std::shared_ptr<cmDebuggerStackFrame> frame = it2->second;
  std::shared_ptr<cmDebuggerVariables> localVariables =
    cmDebuggerVariablesHelper::Create(VariablesManager, "Locals",
                                      supportsVariableType, frame);

  FrameVariables[frameId].emplace_back(localVariables);

  dap::Scope scope;
  scope.name = localVariables->GetName();
  scope.presentationHint = "locals";
  scope.variablesReference = localVariables->GetId();

  dap::Source source;
  source.name = frame->GetFileName();
  source.path = source.name;
  scope.source = source;

  FrameScopes[frameId].push_back(scope);

  dap::ScopesResponse response;
  response.scopes.push_back(scope);
  return response;
}